

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallScriptGenerator.cxx
# Opt level: O2

void __thiscall
cmInstallScriptGenerator::GenerateScriptForConfig
          (cmInstallScriptGenerator *this,ostream *os,string *config,Indent indent)

{
  string *script;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  cmGeneratorExpression ge;
  undefined1 local_70 [8];
  undefined1 local_68 [40];
  string local_40;
  
  if (this->AllowGenex == true) {
    local_68._16_8_ = 0;
    local_68._24_8_ = 0;
    cmGeneratorExpression::cmGeneratorExpression
              ((cmGeneratorExpression *)local_68,(cmListFileBacktrace *)(local_68 + 0x10));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 0x18));
    cmGeneratorExpression::Parse((cmGeneratorExpression *)local_70,(string *)local_68);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    local_40._M_string_length = 0;
    local_40.field_2._M_local_buf[0] = '\0';
    script = cmCompiledGeneratorExpression::Evaluate
                       ((cmCompiledGeneratorExpression *)local_70,this->LocalGenerator,config,false,
                        (cmGeneratorTarget *)0x0,(cmGeneratorTarget *)0x0,
                        (cmGeneratorExpressionDAGChecker *)0x0,&local_40);
    AddScriptInstallRule(this,os,indent,script);
    std::__cxx11::string::~string((string *)&local_40);
    std::
    unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
    ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 *)local_70);
    cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_68);
    return;
  }
  AddScriptInstallRule(this,os,indent,&this->Script);
  return;
}

Assistant:

void cmInstallScriptGenerator::GenerateScriptForConfig(
  std::ostream& os, const std::string& config, Indent indent)
{
  if (this->AllowGenex) {
    cmGeneratorExpression ge;
    std::unique_ptr<cmCompiledGeneratorExpression> cge =
      ge.Parse(this->Script);
    this->AddScriptInstallRule(os, indent,
                               cge->Evaluate(this->LocalGenerator, config));
  } else {
    this->AddScriptInstallRule(os, indent, this->Script);
  }
}